

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtoken.cpp
# Opt level: O1

void __thiscall parse_util::ParseExc::ParseExc(ParseExc *this,string *where,string *par)

{
  ostream *poVar1;
  stringstream ss;
  long *local_1d8 [2];
  long local_1c8 [2];
  runtime_error local_1b8 [16];
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::runtime_error::runtime_error(&this->super_runtime_error,"");
  *(undefined ***)this = &PTR__runtime_error_00122d20;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"Parse error: in ",0x10);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_198,(where->_M_dataplus)._M_p,where->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," param(s) ",10);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(par->_M_dataplus)._M_p,par->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," is unknown",0xb);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(local_1b8,(string *)local_1d8);
  std::runtime_error::operator=(&this->super_runtime_error,local_1b8);
  std::runtime_error::~runtime_error(local_1b8);
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

ParseExc::ParseExc(const string &where, const string &par) :
        std::runtime_error("")
    {
        std::stringstream ss;
        ss << "Parse error: in " << where << " param(s) " << par << " is unknown";
        static_cast<std::runtime_error&>(*this) = std::runtime_error(ss.str());
    }